

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O0

void mempool_destroy(mempool *pool)

{
  bool bVar1;
  slab *local_30;
  slab *tmp;
  slab *slab;
  mempool *pool_local;
  
  tmp = (slab *)((pool->slabs).slabs.next + -1);
  while( true ) {
    bVar1 = false;
    if ((slab_list *)&tmp->next_in_list != &pool->slabs) {
      local_30 = (slab *)((tmp->next_in_list).next + -1);
      bVar1 = local_30 != (slab *)0x0;
    }
    if (!bVar1) break;
    slab_put_with_order(pool->cache,tmp);
    tmp = local_30;
  }
  memset(pool,0,0x70);
  return;
}

Assistant:

void
mempool_destroy(struct mempool *pool)
{
	struct slab *slab, *tmp;
	rlist_foreach_entry_safe(slab, &pool->slabs.slabs,
				 next_in_list, tmp)
		slab_put_with_order(pool->cache, slab);
	/* Safety and also makes mempool_is_initialized work. */
	memset(pool, 0, sizeof(*pool));
}